

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

strong_ordering compareThreeWay(QString *s1,QString *s2)

{
  strong_ordering sVar1;
  QStringView *in_RSI;
  long in_FS_OFFSET;
  QStringView *rhs;
  QStringView *lhs;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QStringView local_28;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rhs = &local_18;
  QStringView::QStringView<QString,_true>
            (in_RSI,(QString *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  lhs = &local_28;
  QStringView::QStringView<QString,_true>
            (in_RSI,(QString *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  sVar1 = compareThreeWay(lhs,rhs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (strong_ordering)sVar1.m_order;
  }
  __stack_chk_fail();
}

Assistant:

friend Qt::strong_ordering compareThreeWay(const QString &s1, const QString &s2) noexcept
    { return compareThreeWay(QStringView(s1), QStringView(s2)); }